

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clEnqueueWriteImage(cl_command_queue command_queue,cl_mem image,cl_bool blocking_write,
                          size_t *origin,size_t *region,size_t input_row_pitch,
                          size_t input_slice_pitch,void *ptr,cl_uint num_events_in_wait_list,
                          cl_event *event_wait_list,cl_event *event)

{
  time_point tickStart;
  time_point tickStart_00;
  time_point tickStart_01;
  time_point tickStart_02;
  time_point tickStart_03;
  __atomic_base<unsigned_long> this;
  __atomic_base<unsigned_long> _Var1;
  __atomic_base<unsigned_long> _Var2;
  bool bVar3;
  bool bVar4;
  cl_icd_dispatch *pcVar5;
  SConfig *pSVar6;
  undefined8 uVar7;
  __atomic_base<unsigned_long> in_RCX;
  cl_bool in_EDX;
  __atomic_base<unsigned_long> in_RSI;
  __atomic_base<unsigned_long> in_RDI;
  __atomic_base<unsigned_long> in_R8;
  __atomic_base<unsigned_long> in_R9;
  cl_command_queue in_stack_00000008;
  cl_command_queue in_stack_00000010;
  cl_uint in_stack_00000018;
  CObjectTracker *in_stack_00000020;
  CObjectTracker *in_stack_00000028;
  time_point toolEnd_3;
  time_point toolStart_3;
  cl_int e;
  time_point toolEnd_2;
  time_point toolStart_2;
  time_point toolEnd_1;
  time_point toolStart_1;
  time_point toolEnd;
  time_point toolStart;
  time_point cpuEnd;
  time_point cpuStart;
  bool isLocalEvent;
  cl_event local_event;
  time_point queuedTime;
  string deviceTag;
  string hostTag;
  string eventWaitListString;
  uint64_t enqueueCounter;
  cl_int retVal;
  CLIntercept *pIntercept;
  char *in_stack_fffffffffffff940;
  undefined8 in_stack_fffffffffffff950;
  undefined4 uVar9;
  CObjectTracker *pCVar8;
  cl_event *in_stack_fffffffffffff958;
  CObjectTracker *this_00;
  CObjectTracker *in_stack_fffffffffffff960;
  CLIntercept *in_stack_fffffffffffff968;
  CLIntercept *in_stack_fffffffffffff970;
  allocator *in_stack_fffffffffffff998;
  __atomic_base<unsigned_long> in_stack_fffffffffffff9a0;
  CLIntercept *in_stack_fffffffffffff9a8;
  allocator *paVar10;
  cl_event *in_stack_fffffffffffff9b0;
  cl_event *in_stack_fffffffffffff9b8;
  undefined8 in_stack_fffffffffffff9c0;
  cl_uint numEvents;
  char *in_stack_fffffffffffff9c8;
  CLIntercept *in_stack_fffffffffffff9d0;
  undefined8 in_stack_fffffffffffff9d8;
  __atomic_base<unsigned_long> _Var11;
  undefined1 includeId;
  allocator *in_stack_fffffffffffff9e0;
  SConfig *in_stack_fffffffffffff9e8;
  __atomic_base<unsigned_long> in_stack_fffffffffffff9f0;
  time_point in_stack_fffffffffffff9f8;
  undefined7 in_stack_fffffffffffffa00;
  undefined1 in_stack_fffffffffffffa07;
  time_point in_stack_fffffffffffffa08;
  time_point in_stack_fffffffffffffa10;
  size_t *in_stack_fffffffffffffa28;
  size_t *in_stack_fffffffffffffa30;
  undefined8 in_stack_fffffffffffffa38;
  cl_bool blockingWrite;
  SConfig *in_stack_fffffffffffffa40;
  SConfig *in_stack_fffffffffffffa48;
  CLIntercept *in_stack_fffffffffffffa50;
  cl_command_queue in_stack_fffffffffffffa58;
  string *in_stack_fffffffffffffa60;
  char *in_stack_fffffffffffffa68;
  CLIntercept *in_stack_fffffffffffffa70;
  CLIntercept *in_stack_fffffffffffffa78;
  time_point in_stack_fffffffffffffa80;
  cl_uint in_stack_fffffffffffffa88;
  cl_event in_stack_fffffffffffffa90;
  cl_event *in_stack_fffffffffffffa98;
  cl_int in_stack_fffffffffffffb54;
  SConfig *in_stack_fffffffffffffb58;
  cl_int errorCode;
  CLIntercept *in_stack_fffffffffffffb60;
  SConfig *in_stack_fffffffffffffb68;
  CLIntercept *in_stack_fffffffffffffb70;
  cl_command_queue p_Var12;
  int local_394;
  undefined8 local_390;
  undefined8 local_388;
  allocator local_379;
  string local_378 [32];
  undefined8 local_358;
  undefined8 local_350;
  allocator local_341;
  string local_340 [32];
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  allocator local_2e9;
  string local_2e8 [16];
  size_t *in_stack_fffffffffffffd28;
  cl_uint in_stack_fffffffffffffd34;
  cl_kernel in_stack_fffffffffffffd38;
  uint64_t in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  CLIntercept *in_stack_fffffffffffffd50;
  size_t *in_stack_fffffffffffffd60;
  cl_command_queue in_stack_fffffffffffffd68;
  undefined8 local_270;
  allocator local_251;
  string local_250 [32];
  undefined8 local_230;
  undefined8 local_228;
  allocator local_219;
  string local_218 [32];
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  allocator local_1c1;
  string local_1c0 [32];
  undefined8 local_1a0;
  undefined8 local_198;
  allocator local_189;
  string local_188 [32];
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  __atomic_base<unsigned_long> in_stack_fffffffffffffec8;
  undefined8 local_110;
  undefined8 local_108;
  undefined1 local_f0 [48];
  string local_c0 [48];
  string local_90 [32];
  __atomic_base<unsigned_long> local_70;
  cl_int local_64;
  __atomic_base<unsigned_long> local_60;
  __atomic_base<unsigned_long> local_58;
  __atomic_base<unsigned_long> local_50;
  __atomic_base<unsigned_long> local_48;
  cl_bool local_3c;
  __atomic_base<unsigned_long> local_38;
  __atomic_base<unsigned_long> local_30;
  cl_int local_24;
  
  includeId = (undefined1)((ulong)in_stack_fffffffffffff9d8 >> 0x38);
  numEvents = (cl_uint)((ulong)in_stack_fffffffffffff9c0 >> 0x20);
  blockingWrite = (cl_bool)((ulong)in_stack_fffffffffffffa38 >> 0x20);
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffff950 >> 0x20);
  local_58._M_i = in_R9._M_i;
  local_50._M_i = in_R8._M_i;
  local_48._M_i = in_RCX._M_i;
  local_3c = in_EDX;
  local_38._M_i = in_RSI._M_i;
  local_30._M_i = in_RDI._M_i;
  local_60._M_i = (__int_type)GetIntercept();
  if (((CLIntercept *)local_60._M_i == (CLIntercept *)0x0) ||
     (pcVar5 = CLIntercept::dispatch((CLIntercept *)local_60._M_i),
     pcVar5->clEnqueueWriteImage == (cl_api_clEnqueueWriteImage)0x0)) {
    local_394 = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_394);
    local_24 = -0x24;
  }
  else {
    local_64 = 0;
    local_70._M_i = CLIntercept::incrementEnqueueCounter(in_stack_fffffffffffff9a8);
    pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
    if ((((pSVar6->AubCapture & 1U) != 0) &&
        (bVar3 = CLIntercept::checkAubCaptureEnqueueLimits
                           ((CLIntercept *)local_60._M_i,local_70._M_i), bVar3)) &&
       (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
       (pSVar6->AubCaptureIndividualEnqueues & 1U) == 0)) {
      in_stack_fffffffffffff940 = (char *)local_30._M_i;
      CLIntercept::startAubCapture
                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                 in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,in_stack_fffffffffffffd28,
                 in_stack_fffffffffffffd60,in_stack_fffffffffffffd68);
    }
    pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
    if ((pSVar6->NullEnqueue & 1U) == 0) {
      getFormattedEventWaitList_abi_cxx11_
                (in_stack_fffffffffffff968,(cl_uint)((ulong)in_stack_fffffffffffff960 >> 0x20),
                 in_stack_fffffffffffff958);
      pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
      _Var2._M_i = local_30._M_i;
      _Var1._M_i = local_38._M_i;
      this._M_i = local_60._M_i;
      _Var11._M_i = local_70._M_i;
      if ((pSVar6->CallLogging & 1U) != 0) {
        in_stack_fffffffffffff940 = "non-blocking";
        if (local_3c != 0) {
          in_stack_fffffffffffff940 = "blocking";
        }
        p_Var12 = in_stack_00000010;
        uVar7 = std::__cxx11::string::c_str();
        CLIntercept::callLoggingEnter
                  ((CLIntercept *)this._M_i,"clEnqueueWriteImage",_Var11._M_i,(cl_kernel)0x0,
                   "queue = %p, image = %p, %s, ptr = %p%s",_Var2._M_i,_Var1._M_i,
                   in_stack_fffffffffffff940,p_Var12,uVar7);
        uVar9 = (undefined4)((ulong)uVar7 >> 0x20);
      }
      pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
      if ((pSVar6->EventChecking & 1U) != 0) {
        CLIntercept::checkEventList
                  (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,numEvents,
                   in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
      }
      std::__cxx11::string::string(local_c0);
      std::__cxx11::string::string((string *)(local_f0 + 0x10));
      pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
      if ((((pSVar6->ChromeCallLogging & 1U) != 0) ||
          ((pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
           (pSVar6->HostPerformanceTiming & 1U) != 0 &&
           (bVar3 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              ((CLIntercept *)local_60._M_i,local_70._M_i), bVar3)))) ||
         (((pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
           (pSVar6->DevicePerformanceTiming & 1U) != 0 ||
           (((pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
             (pSVar6->ITTPerformanceTiming & 1U) != 0 ||
             (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
             (pSVar6->ChromePerformanceTiming & 1U) != 0)) ||
            (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
            (pSVar6->DevicePerfCounterEventBasedSampling & 1U) != 0)))) &&
          (bVar3 = CLIntercept::checkDevicePerformanceTimingEnqueueLimits
                             ((CLIntercept *)local_60._M_i,local_70._M_i), bVar3)))) {
        CLIntercept::getTimingTagBlocking
                  (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                   (cl_bool)((ulong)in_stack_fffffffffffffa60 >> 0x20),
                   (size_t)in_stack_fffffffffffffa58,(string *)in_stack_fffffffffffffa50,
                   (string *)in_stack_fffffffffffffa48);
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffff940);
      local_f0._0_8_ = 0;
      bVar3 = false;
      pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
      if (((((pSVar6->DevicePerformanceTiming & 1U) != 0) ||
           (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
           (pSVar6->ITTPerformanceTiming & 1U) != 0)) ||
          (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
          (pSVar6->ChromePerformanceTiming & 1U) != 0)) ||
         (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
         (pSVar6->DevicePerfCounterEventBasedSampling & 1U) != 0)) {
        local_f0._8_8_ = std::chrono::_V2::steady_clock::now();
        bVar3 = in_stack_00000028 == (CObjectTracker *)0x0;
        if (bVar3) {
          in_stack_00000028 = (CObjectTracker *)local_f0;
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffff940);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffff940);
      pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
      if (((pSVar6->HostPerformanceTiming & 1U) != 0) ||
         (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
         (pSVar6->ChromeCallLogging & 1U) != 0)) {
        local_108 = std::chrono::_V2::steady_clock::now();
      }
      pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
      if ((pSVar6->OverrideWriteImage & 1U) == 0) {
        pcVar5 = CLIntercept::dispatch((CLIntercept *)local_60._M_i);
        this_00 = in_stack_00000028;
        local_64 = (*pcVar5->clEnqueueWriteImage)
                             ((cl_command_queue)local_30._M_i,(cl_mem)local_38._M_i,local_3c,
                              (size_t *)local_48._M_i,(size_t *)local_50._M_i,local_58._M_i,
                              (size_t)in_stack_00000008,in_stack_00000010,in_stack_00000018,
                              (cl_event *)in_stack_00000020,(cl_event *)in_stack_00000028);
        in_stack_fffffffffffff940 = (char *)in_stack_00000010;
      }
      else {
        pCVar8 = (CObjectTracker *)CONCAT44(uVar9,in_stack_00000018);
        this_00 = in_stack_00000020;
        in_stack_fffffffffffff960 = in_stack_00000028;
        local_64 = CLIntercept::WriteImage
                             (in_stack_fffffffffffffa50,(cl_command_queue)in_stack_fffffffffffffa48,
                              (cl_mem)in_stack_fffffffffffffa40,blockingWrite,
                              in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
                              (size_t)in_stack_fffffffffffffa70,(size_t)in_stack_fffffffffffffa78,
                              (void *)in_stack_fffffffffffffa80.__d.__r,in_stack_fffffffffffffa88,
                              (cl_event *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa98);
        in_stack_fffffffffffff940 = (char *)in_stack_00000008;
        in_stack_00000020 = pCVar8;
      }
      pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
      if (((pSVar6->HostPerformanceTiming & 1U) != 0) ||
         (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
         (pSVar6->ChromeCallLogging & 1U) != 0)) {
        local_110 = std::chrono::_V2::steady_clock::now();
        pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
        if (((pSVar6->HostPerformanceTiming & 1U) != 0) &&
           (bVar4 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              ((CLIntercept *)local_60._M_i,local_70._M_i), bVar4)) {
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                     (char *)in_stack_fffffffffffff9f8.__d.__r,
                     (string *)in_stack_fffffffffffff9f0._M_i,in_stack_fffffffffffffa10,
                     in_stack_fffffffffffffa08);
        }
      }
      in_stack_fffffffffffffb70 = (CLIntercept *)CLIntercept::config((CLIntercept *)local_60._M_i);
      if (((((((ulong)(in_stack_fffffffffffffb70->m_Dispatch).clCreateContextFromType & 0x10000) !=
              0) || (in_stack_fffffffffffffb68 = CLIntercept::config((CLIntercept *)local_60._M_i),
                    (in_stack_fffffffffffffb68->ITTPerformanceTiming & 1U) != 0)) ||
           (in_stack_fffffffffffffb60 =
                 (CLIntercept *)CLIntercept::config((CLIntercept *)local_60._M_i),
           ((ulong)(in_stack_fffffffffffffb60->m_Dispatch).clRetainSampler & 0x1000000000000) != 0))
          || (in_stack_fffffffffffffb58 = CLIntercept::config((CLIntercept *)local_60._M_i),
             (in_stack_fffffffffffffb58->DevicePerfCounterEventBasedSampling & 1U) != 0)) &&
         (in_stack_00000028 != (CObjectTracker *)0x0)) {
        bVar4 = CLIntercept::checkDevicePerformanceTimingEnqueueLimits
                          ((CLIntercept *)local_60._M_i,local_70._M_i);
        in_stack_fffffffffffffb54 = CONCAT13(bVar4,(int3)in_stack_fffffffffffffb54);
        if (bVar4) {
          in_stack_fffffffffffffec8._M_i = local_f0._8_8_;
          CLIntercept::addTimingEvent
                    (in_stack_fffffffffffffa78,(char *)in_stack_fffffffffffffa70,
                     (uint64_t)in_stack_fffffffffffffa68,in_stack_fffffffffffffa80,
                     in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa90);
        }
        if (bVar3) {
          pcVar5 = CLIntercept::dispatch((CLIntercept *)local_60._M_i);
          (*pcVar5->clReleaseEvent)
                    ((cl_event)
                     (in_stack_00000028->m_Devices).NumAllocations.
                     super___atomic_base<unsigned_long>._M_i);
          in_stack_00000028 = (CObjectTracker *)0x0;
        }
      }
      pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
      if (((((pSVar6->ErrorLogging & 1U) != 0) ||
           (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
           (pSVar6->ErrorAssert & 1U) != 0)) ||
          (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i), (pSVar6->NoErrors & 1U) != 0)
          ) && (local_64 != 0)) {
        pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
        if ((pSVar6->ErrorLogging & 1U) != 0) {
          CLIntercept::logError
                    (in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->SuppressLogging,
                     in_stack_fffffffffffffb54);
        }
        pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
        if ((pSVar6->ErrorAssert & 1U) != 0) {
          raise(5);
        }
        pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
        if ((pSVar6->NoErrors & 1U) != 0) {
          local_64 = 0;
        }
      }
      pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
      if ((pSVar6->LeakChecking & 1U) != 0) {
        CLIntercept::objectTracker((CLIntercept *)local_60._M_i);
        CObjectTracker::AddAllocation<_cl_event*>(this_00,(_cl_event *)in_stack_00000020);
      }
      pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
      if ((pSVar6->CallLogging & 1U) != 0) {
        CLIntercept::callLoggingExit
                  (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,numEvents,
                   in_stack_fffffffffffff9b8,(cl_sync_point_khr *)in_stack_fffffffffffff9b0);
      }
      pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
      if ((pSVar6->ChromeCallLogging & 1U) != 0) {
        local_140 = local_108;
        local_148 = local_110;
        tickStart.__d.__r._7_1_ = in_stack_fffffffffffffa07;
        tickStart.__d.__r._0_7_ = in_stack_fffffffffffffa00;
        CLIntercept::chromeCallLoggingExit
                  ((CLIntercept *)in_stack_fffffffffffff9f0._M_i,
                   &in_stack_fffffffffffff9e8->SuppressLogging,(string *)in_stack_fffffffffffff9e0,
                   (bool)includeId,(uint64_t)in_stack_fffffffffffff9d0,tickStart,
                   in_stack_fffffffffffff9f8);
      }
      if ((local_3c != 0) &&
         (((pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
           (pSVar6->DevicePerformanceTiming & 1U) != 0 ||
           (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
           (pSVar6->ITTPerformanceTiming & 1U) != 0)) ||
          ((pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
           (pSVar6->ChromePerformanceTiming & 1U) != 0 ||
           ((pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
            (pSVar6->DevicePerfCounterEventBasedSampling & 1U) != 0 ||
            (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
            (pSVar6->DevicePerfCounterTimeBasedSampling & 1U) != 0)))))))) {
        std::chrono::
        time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffff940);
        std::chrono::
        time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffff940);
        pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
        if (((pSVar6->ToolOverheadTiming & 1U) != 0) &&
           ((pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
            (pSVar6->HostPerformanceTiming & 1U) != 0 ||
            (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
            (pSVar6->ChromeCallLogging & 1U) != 0)))) {
          local_160 = std::chrono::_V2::steady_clock::now();
          local_150 = local_160;
        }
        CLIntercept::checkTimingEvents((CLIntercept *)in_stack_fffffffffffffec8._M_i);
        pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
        if (((pSVar6->ToolOverheadTiming & 1U) != 0) &&
           ((pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
            (pSVar6->HostPerformanceTiming & 1U) != 0 ||
            (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
            (pSVar6->ChromeCallLogging & 1U) != 0)))) {
          local_168 = std::chrono::_V2::steady_clock::now();
          local_158 = local_168;
          pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
          if (((pSVar6->HostPerformanceTiming & 1U) != 0) &&
             (bVar3 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                                ((CLIntercept *)local_60._M_i,local_70._M_i), bVar3)) {
            paVar10 = &local_189;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_188,"",paVar10);
            local_198 = local_150;
            local_1a0 = local_158;
            CLIntercept::updateHostTimingStats
                      ((CLIntercept *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                       (char *)in_stack_fffffffffffff9f8.__d.__r,
                       (string *)in_stack_fffffffffffff9f0._M_i,in_stack_fffffffffffffa10,
                       in_stack_fffffffffffffa08);
            std::__cxx11::string::~string(local_188);
            std::allocator<char>::~allocator((allocator<char> *)&local_189);
          }
          pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
          if ((pSVar6->ChromeCallLogging & 1U) != 0) {
            paVar10 = &local_1c1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1c0,"",paVar10);
            local_1d0 = local_150;
            local_1d8 = local_158;
            tickStart_00.__d.__r._7_1_ = in_stack_fffffffffffffa07;
            tickStart_00.__d.__r._0_7_ = in_stack_fffffffffffffa00;
            CLIntercept::chromeCallLoggingExit
                      ((CLIntercept *)in_stack_fffffffffffff9f0._M_i,
                       &in_stack_fffffffffffff9e8->SuppressLogging,
                       (string *)in_stack_fffffffffffff9e0,(bool)includeId,
                       (uint64_t)in_stack_fffffffffffff9d0,tickStart_00,in_stack_fffffffffffff9f8);
            std::__cxx11::string::~string(local_1c0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
          }
        }
      }
      if ((((local_3c != 0) &&
           (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
           pSVar6->ChromeTraceBufferSize != 0)) &&
          (in_stack_fffffffffffffa50 =
                (CLIntercept *)CLIntercept::config((CLIntercept *)local_60._M_i),
          ((in_stack_fffffffffffffa50->m_Mutex).super___mutex_base._M_mutex.__size[0x10] & 1U) != 0)
          ) && ((in_stack_fffffffffffffa48 = CLIntercept::config((CLIntercept *)local_60._M_i),
                (in_stack_fffffffffffffa48->ChromeCallLogging & 1U) != 0 ||
                (in_stack_fffffffffffffa40 = CLIntercept::config((CLIntercept *)local_60._M_i),
                (in_stack_fffffffffffffa40->ChromePerformanceTiming & 1U) != 0)))) {
        std::chrono::
        time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffff940);
        std::chrono::
        time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffff940);
        pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
        if (((pSVar6->ToolOverheadTiming & 1U) != 0) &&
           ((pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
            (pSVar6->HostPerformanceTiming & 1U) != 0 ||
            (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
            (pSVar6->ChromeCallLogging & 1U) != 0)))) {
          local_1f0 = std::chrono::_V2::steady_clock::now();
          local_1e0 = local_1f0;
        }
        CLIntercept::flushChromeTraceBuffering((CLIntercept *)0x138878);
        pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
        if (((pSVar6->ToolOverheadTiming & 1U) != 0) &&
           ((pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
            (pSVar6->HostPerformanceTiming & 1U) != 0 ||
            (in_stack_fffffffffffffa10.__d.__r =
                  (duration)CLIntercept::config((CLIntercept *)local_60._M_i),
            (((SConfig *)in_stack_fffffffffffffa10.__d.__r)->ChromeCallLogging & 1U) != 0)))) {
          local_1f8 = std::chrono::_V2::steady_clock::now();
          local_1e8 = local_1f8;
          in_stack_fffffffffffffa08.__d.__r =
               (duration)CLIntercept::config((CLIntercept *)local_60._M_i);
          if (((((SConfig *)in_stack_fffffffffffffa08.__d.__r)->HostPerformanceTiming & 1U) != 0) &&
             (in_stack_fffffffffffffa07 =
                   CLIntercept::checkHostPerformanceTimingEnqueueLimits
                             ((CLIntercept *)local_60._M_i,local_70._M_i),
             (bool)in_stack_fffffffffffffa07)) {
            in_stack_fffffffffffff9f8.__d.__r = (duration)&local_219;
            in_stack_fffffffffffff9f0._M_i = local_60._M_i;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_218,"",(allocator *)in_stack_fffffffffffff9f8.__d.__r);
            local_228 = local_1e0;
            local_230 = local_1e8;
            CLIntercept::updateHostTimingStats
                      ((CLIntercept *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                       (char *)in_stack_fffffffffffff9f8.__d.__r,
                       (string *)in_stack_fffffffffffff9f0._M_i,in_stack_fffffffffffffa10,
                       in_stack_fffffffffffffa08);
            std::__cxx11::string::~string(local_218);
            std::allocator<char>::~allocator((allocator<char> *)&local_219);
          }
          in_stack_fffffffffffff9e8 = CLIntercept::config((CLIntercept *)local_60._M_i);
          if ((in_stack_fffffffffffff9e8->ChromeCallLogging & 1U) != 0) {
            in_stack_fffffffffffff9e0 = &local_251;
            _Var11._M_i = local_60._M_i;
            std::allocator<char>::allocator();
            includeId = (undefined1)(_Var11._M_i >> 0x38);
            std::__cxx11::string::string(local_250,"",in_stack_fffffffffffff9e0);
            tickStart_01.__d.__r._7_1_ = in_stack_fffffffffffffa07;
            tickStart_01.__d.__r._0_7_ = in_stack_fffffffffffffa00;
            CLIntercept::chromeCallLoggingExit
                      ((CLIntercept *)in_stack_fffffffffffff9f0._M_i,
                       &in_stack_fffffffffffff9e8->SuppressLogging,
                       (string *)in_stack_fffffffffffff9e0,(bool)includeId,
                       (uint64_t)in_stack_fffffffffffff9d0,tickStart_01,in_stack_fffffffffffff9f8);
            std::__cxx11::string::~string(local_250);
            std::allocator<char>::~allocator((allocator<char> *)&local_251);
          }
        }
      }
      if (in_stack_00000028 == (CObjectTracker *)0x0) {
        in_stack_fffffffffffff9d0 = (CLIntercept *)0x0;
      }
      else {
        in_stack_fffffffffffff9d0 =
             (CLIntercept *)
             (in_stack_00000028->m_Devices).NumAllocations.super___atomic_base<unsigned_long>._M_i;
      }
      if ((in_stack_fffffffffffff9d0 != (CLIntercept *)0x0) &&
         ((pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
          (pSVar6->ChromeCallLogging & 1U) != 0 ||
          (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
          (pSVar6->ChromePerformanceTiming & 1U) != 0)))) {
        CLIntercept::addEvent
                  (in_stack_fffffffffffff970,(cl_event)in_stack_fffffffffffff968,
                   (uint64_t)in_stack_fffffffffffff960);
      }
      std::__cxx11::string::~string((string *)(local_f0 + 0x10));
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_90);
    }
    errorCode = (cl_int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
    pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
    if ((pSVar6->FinishAfterEnqueue & 1U) == 0) {
      pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
      if ((pSVar6->FlushAfterEnqueue & 1U) != 0) {
        pcVar5 = CLIntercept::dispatch((CLIntercept *)local_60._M_i);
        (*pcVar5->clFlush)((cl_command_queue)local_30._M_i);
      }
    }
    else {
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffff940);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffff940);
      pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
      if (((pSVar6->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
          (pSVar6->HostPerformanceTiming & 1U) != 0 ||
          (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
          (pSVar6->ChromeCallLogging & 1U) != 0)))) {
        local_270 = std::chrono::_V2::steady_clock::now();
      }
      CLIntercept::logFlushOrFinishAfterEnqueueStart
                (in_stack_fffffffffffffa50,&in_stack_fffffffffffffa48->SuppressLogging,
                 &in_stack_fffffffffffffa40->SuppressLogging);
      pcVar5 = CLIntercept::dispatch((CLIntercept *)local_60._M_i);
      (*pcVar5->clFinish)((cl_command_queue)local_30._M_i);
      CLIntercept::logFlushOrFinishAfterEnqueueEnd
                (in_stack_fffffffffffffb70,&in_stack_fffffffffffffb68->SuppressLogging,
                 (char *)in_stack_fffffffffffffb60,errorCode);
      pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
      if (((pSVar6->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
          (pSVar6->HostPerformanceTiming & 1U) != 0 ||
          (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
          (pSVar6->ChromeCallLogging & 1U) != 0)))) {
        uVar7 = std::chrono::_V2::steady_clock::now();
        pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
        if (((pSVar6->HostPerformanceTiming & 1U) != 0) &&
           (bVar3 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              ((CLIntercept *)local_60._M_i,local_70._M_i), bVar3)) {
          paVar10 = (allocator *)&stack0xfffffffffffffd4f;
          in_stack_fffffffffffff9a0._M_i = local_60._M_i;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&stack0xfffffffffffffd50,"",paVar10);
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                     (char *)in_stack_fffffffffffff9f8.__d.__r,
                     (string *)in_stack_fffffffffffff9f0._M_i,in_stack_fffffffffffffa10,
                     in_stack_fffffffffffffa08);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffd50);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd4f);
        }
        pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
        if ((pSVar6->ChromeCallLogging & 1U) != 0) {
          in_stack_fffffffffffff998 = &local_2e9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2e8,"",in_stack_fffffffffffff998);
          local_2f8 = local_270;
          tickStart_02.__d.__r._7_1_ = in_stack_fffffffffffffa07;
          tickStart_02.__d.__r._0_7_ = in_stack_fffffffffffffa00;
          local_300 = uVar7;
          CLIntercept::chromeCallLoggingExit
                    ((CLIntercept *)in_stack_fffffffffffff9f0._M_i,
                     &in_stack_fffffffffffff9e8->SuppressLogging,(string *)in_stack_fffffffffffff9e0
                     ,(bool)includeId,(uint64_t)in_stack_fffffffffffff9d0,tickStart_02,
                     in_stack_fffffffffffff9f8);
          std::__cxx11::string::~string(local_2e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffff940);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffff940);
      pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
      if (((pSVar6->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
          (pSVar6->HostPerformanceTiming & 1U) != 0 ||
          (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
          (pSVar6->ChromeCallLogging & 1U) != 0)))) {
        local_318 = std::chrono::_V2::steady_clock::now();
        local_308 = local_318;
      }
      CLIntercept::checkTimingEvents((CLIntercept *)in_stack_fffffffffffffec8._M_i);
      pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
      if (((pSVar6->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
          (pSVar6->HostPerformanceTiming & 1U) != 0 ||
          (pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
          (pSVar6->ChromeCallLogging & 1U) != 0)))) {
        local_320 = std::chrono::_V2::steady_clock::now();
        local_310 = local_320;
        pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
        if (((pSVar6->HostPerformanceTiming & 1U) != 0) &&
           (bVar3 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              ((CLIntercept *)local_60._M_i,local_70._M_i), bVar3)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_340,"",&local_341);
          local_350 = local_308;
          local_358 = local_310;
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                     (char *)in_stack_fffffffffffff9f8.__d.__r,
                     (string *)in_stack_fffffffffffff9f0._M_i,in_stack_fffffffffffffa10,
                     in_stack_fffffffffffffa08);
          std::__cxx11::string::~string(local_340);
          std::allocator<char>::~allocator((allocator<char> *)&local_341);
        }
        pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
        if ((pSVar6->ChromeCallLogging & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_378,"",&local_379);
          local_388 = local_308;
          local_390 = local_310;
          tickStart_03.__d.__r._7_1_ = in_stack_fffffffffffffa07;
          tickStart_03.__d.__r._0_7_ = in_stack_fffffffffffffa00;
          CLIntercept::chromeCallLoggingExit
                    ((CLIntercept *)in_stack_fffffffffffff9f0._M_i,
                     &in_stack_fffffffffffff9e8->SuppressLogging,(string *)in_stack_fffffffffffff9e0
                     ,(bool)includeId,(uint64_t)in_stack_fffffffffffff9d0,tickStart_03,
                     in_stack_fffffffffffff9f8);
          std::__cxx11::string::~string(local_378);
          std::allocator<char>::~allocator((allocator<char> *)&local_379);
        }
      }
    }
    pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i);
    if (((pSVar6->AubCapture & 1U) != 0) &&
       ((pSVar6 = CLIntercept::config((CLIntercept *)local_60._M_i),
        (pSVar6->AubCaptureIndividualEnqueues & 1U) != 0 ||
        (bVar3 = CLIntercept::checkAubCaptureEnqueueLimits
                           ((CLIntercept *)local_60._M_i,local_70._M_i), !bVar3)))) {
      CLIntercept::stopAubCapture
                ((CLIntercept *)in_stack_fffffffffffff9a0._M_i,
                 (cl_command_queue)in_stack_fffffffffffff998);
    }
    local_24 = local_64;
  }
  return local_24;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clEnqueueWriteImage)(
    cl_command_queue command_queue,
    cl_mem image,
    cl_bool blocking_write,
    const size_t* origin,
    const size_t* region,
    size_t input_row_pitch,
    size_t input_slice_pitch,
    const void* ptr,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clEnqueueWriteImage )
    {
        cl_int  retVal = CL_SUCCESS;

        INCREMENT_ENQUEUE_COUNTER();
        CHECK_AUBCAPTURE_START( command_queue );

        if( pIntercept->config().NullEnqueue == false )
        {
            const std::string eventWaitListString = getFormattedEventWaitList(
                pIntercept,
                num_events_in_wait_list,
                event_wait_list);

            CALL_LOGGING_ENTER(
                "queue = %p, image = %p, %s, ptr = %p%s",
                command_queue,
                image,
                blocking_write ? "blocking" : "non-blocking",
                ptr,
                eventWaitListString.c_str() );
            CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
            GET_TIMING_TAGS_BLOCKING( blocking_write, 0 );
            DEVICE_PERFORMANCE_TIMING_START( event );
            HOST_PERFORMANCE_TIMING_START();

            ITT_ADD_PARAM_AS_METADATA( blocking_write );

            if( pIntercept->config().OverrideWriteImage )
            {
                retVal = pIntercept->WriteImage(
                    command_queue,
                    image,
                    blocking_write,
                    origin,
                    region,
                    input_row_pitch,
                    input_slice_pitch,
                    ptr,
                    num_events_in_wait_list,
                    event_wait_list,
                    event );
            }
            else
            {
                retVal = pIntercept->dispatch().clEnqueueWriteImage(
                    command_queue,
                    image,
                    blocking_write,
                    origin,
                    region,
                    input_row_pitch,
                    input_slice_pitch,
                    ptr,
                    num_events_in_wait_list,
                    event_wait_list,
                    event );
            }

            HOST_PERFORMANCE_TIMING_END_WITH_TAG();
            DEVICE_PERFORMANCE_TIMING_END_WITH_TAG( command_queue, event );
            CHECK_ERROR( retVal );
            ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
            CALL_LOGGING_EXIT_EVENT_WITH_TAG( retVal, event );
            DEVICE_PERFORMANCE_TIMING_CHECK_CONDITIONAL( blocking_write );
            FLUSH_CHROME_TRACE_BUFFERING_CONDITIONAL( blocking_write );
            ADD_EVENT( event ? event[0] : NULL );
        }

        FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
        CHECK_AUBCAPTURE_STOP( command_queue );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}